

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharAndCodeTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  int value;
  int value_00;
  long lVar4;
  char *pcVar5;
  undefined7 in_register_00000039;
  ulong uVar6;
  int iVar7;
  string local_60;
  string local_40;
  
  uVar6 = CONCAT71(in_register_00000039,c);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar7 = (int)uVar6;
  switch(uVar6 & 0xffffffff) {
  case 0:
    pcVar5 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0015b911_caseD_1:
    if (0x5e < iVar7 - 0x20U) {
      String::FormatHexInt_abi_cxx11_(&local_60,(String *)(uVar6 & 0xffffffff),value);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x16d2b7);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_40.field_2._M_allocated_capacity = *psVar3;
        local_40.field_2._8_8_ = plVar2[3];
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      }
      else {
        local_40.field_2._M_allocated_capacity = *psVar3;
        local_40._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_40._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_40._M_dataplus._M_p,local_40._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      bVar1 = true;
      goto LAB_0015b9a4;
    }
    pcVar5 = (char *)&local_40;
    local_40._M_dataplus._M_p._0_1_ = c;
    lVar4 = 1;
    goto LAB_0015b999;
  case 7:
    pcVar5 = "\\a";
    break;
  case 8:
    pcVar5 = "\\b";
    break;
  case 9:
    pcVar5 = "\\t";
    break;
  case 10:
    pcVar5 = "\\n";
    break;
  case 0xb:
    pcVar5 = "\\v";
    break;
  case 0xc:
    pcVar5 = "\\f";
    break;
  case 0xd:
    pcVar5 = "\\r";
    break;
  default:
    if (iVar7 == 0x27) {
      pcVar5 = "\\\'";
    }
    else {
      if (iVar7 != 0x5c) goto switchD_0015b911_caseD_1;
      pcVar5 = "\\\\";
    }
  }
  lVar4 = 2;
LAB_0015b999:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar4);
  bVar1 = false;
LAB_0015b9a4:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    std::ostream::operator<<((ostream *)os,iVar7);
    if (9 < c && !bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
      String::FormatHexInt_abi_cxx11_(&local_40,(String *)(uVar6 & 0xffffffff),value_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_40._M_dataplus._M_p,local_40._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}